

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O0

void __thiscall miniros::TransportTCP::TransportTCP(TransportTCP *this,PollSet *poll_set,int flags)

{
  undefined4 in_EDX;
  undefined8 in_RSI;
  function<void_(const_std::shared_ptr<miniros::TransportTCP>_&)> *in_RDI;
  Transport *in_stack_00000680;
  
  Transport::Transport(in_stack_00000680);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__TransportTCP_006203f8;
  *(undefined4 *)&in_RDI[4]._M_invoker = 0xffffffff;
  *(undefined1 *)((long)&in_RDI[4]._M_invoker + 4) = 0;
  std::recursive_mutex::recursive_mutex((recursive_mutex *)0x50a2d1);
  in_RDI[6].super__Function_base._M_functor._M_pod_data[8] = '\0';
  in_RDI[6].super__Function_base._M_functor._M_pod_data[9] = '\0';
  in_RDI[6].super__Function_base._M_functor._M_pod_data[10] = '\0';
  *(undefined4 *)((long)&in_RDI[0xe]._M_invoker + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[0xf].super__Function_base._M_functor = 0xffffffff;
  std::function<void_(const_std::shared_ptr<miniros::TransportTCP>_&)>::function(in_RDI);
  std::__cxx11::string::string
            ((string *)(in_RDI[0x10].super__Function_base._M_functor._M_pod_data + 8));
  *(undefined8 *)((long)&in_RDI[0x11].super__Function_base._M_functor + 8) = in_RSI;
  *(undefined4 *)&in_RDI[0x11].super__Function_base._M_manager = in_EDX;
  std::__cxx11::string::string((string *)&in_RDI[0x11]._M_invoker);
  return;
}

Assistant:

TransportTCP::TransportTCP(PollSet* poll_set, int flags)
: sock_(ROS_INVALID_SOCKET)
, closed_(false)
, expecting_read_(false)
, expecting_write_(false)
, is_server_(false)
, server_port_(-1)
, local_port_(-1)
, poll_set_(poll_set)
, flags_(flags)
{

}